

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O2

bool_t bignIsOperable(bign_params *params)

{
  bool_t bVar1;
  uint uVar2;
  size_t sVar4;
  ulong count;
  uint uVar3;
  
  sVar4 = params->l;
  uVar2 = 0;
  uVar3 = 0;
  if ((((sVar4 == 0x80) || (sVar4 == 0x100)) || (sVar4 == 0xc0)) &&
     (((~params->p[0] & 3) == 0 && ((params->q[0] & 1) != 0)))) {
    count = sVar4 * 2 + 7 >> 3;
    uVar2 = uVar3;
    if (((char)params->p[count - 1] < '\0') && ((char)params->b[count + 0x3f] < '\0')) {
      sVar4 = 0x40 - count;
      bVar1 = memIsZero(params->p + count,sVar4);
      if (bVar1 != 0) {
        bVar1 = memIsZero(params->a,count);
        if (bVar1 == 0) {
          bVar1 = memIsZero(params->b,count);
          if (bVar1 == 0) {
            bVar1 = memIsZero(params->a + count,sVar4);
            if (bVar1 != 0) {
              bVar1 = memIsZero(params->b + count,sVar4);
              if (bVar1 != 0) {
                bVar1 = memIsZero(params->q + count,sVar4);
                if (bVar1 != 0) {
                  bVar1 = memIsZero(params->yG + count,sVar4);
                  uVar2 = (uint)(bVar1 != 0);
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

bool_t bignIsOperable(const bign_params* params)
{
	size_t no;
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	// корректный уровень стойкости?
	// p mod 4 == 3? q mod 2 == 1?
	// p и q -- 2l-битовые?
	// a != 0? b != 0?
	// неиспользуемые октеты обнулены?
	return
		(params->l == 128 || params->l == 192 || params->l == 256) &&
		(no = O_OF_B(2 * params->l)) &&
		params->p[0] % 4 == 3 && params->q[0] % 2 == 1 &&
		params->p[no - 1] >= 128 && params->q[no - 1] >= 128 &&
		memIsZero(params->p + no, sizeof(params->p) - no) &&
		!memIsZero(params->a, no) &&
		!memIsZero(params->b, no) &&
		memIsZero(params->a + no, sizeof(params->a) - no) &&
		memIsZero(params->b + no, sizeof(params->b) - no) &&
		memIsZero(params->q + no, sizeof(params->q) - no) &&
		memIsZero(params->yG + no, sizeof(params->yG) - no);
}